

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void checkPtrmap(IntegrityCk *pCheck,Pgno iChild,u8 eType,Pgno iParent)

{
  int iVar1;
  uint in_ECX;
  undefined1 in_DL;
  uint in_ESI;
  IntegrityCk *in_RDI;
  long in_FS_OFFSET;
  int rc;
  Pgno iPtrmapParent;
  u8 ePtrmapType;
  undefined3 in_stack_ffffffffffffffe0;
  undefined4 uVar2;
  byte bVar3;
  undefined3 in_stack_fffffffffffffff4;
  Pgno key;
  byte bVar4;
  BtShared *pBt;
  
  pBt = *(BtShared **)(in_FS_OFFSET + 0x28);
  uVar2 = CONCAT13(in_DL,in_stack_ffffffffffffffe0);
  key = CONCAT13(0xaa,in_stack_fffffffffffffff4);
  iVar1 = ptrmapGet(pBt,key,(u8 *)in_RDI,(Pgno *)CONCAT44(in_ESI,uVar2));
  if (iVar1 == 0) {
    bVar4 = (byte)(key >> 0x18);
    bVar3 = (byte)((uint)uVar2 >> 0x18);
    if ((bVar4 != bVar3) || (in_ECX != 0xaaaaaaaa)) {
      checkAppendMsg(in_RDI,"Bad ptr map entry key=%u expected=(%u,%u) got=(%u,%u)",(ulong)in_ESI,
                     (ulong)bVar3,(ulong)in_ECX,(ulong)bVar4,0xaaaaaaaa);
    }
  }
  else {
    if ((iVar1 == 7) || (iVar1 == 0xc0a)) {
      checkOom(in_RDI);
    }
    checkAppendMsg(in_RDI,"Failed to read ptrmap key=%u",(ulong)in_ESI);
  }
  if (*(BtShared **)(in_FS_OFFSET + 0x28) == pBt) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void checkPtrmap(
  IntegrityCk *pCheck,   /* Integrity check context */
  Pgno iChild,           /* Child page number */
  u8 eType,              /* Expected pointer map type */
  Pgno iParent           /* Expected pointer map parent page number */
){
  int rc;
  u8 ePtrmapType;
  Pgno iPtrmapParent;

  rc = ptrmapGet(pCheck->pBt, iChild, &ePtrmapType, &iPtrmapParent);
  if( rc!=SQLITE_OK ){
    if( rc==SQLITE_NOMEM || rc==SQLITE_IOERR_NOMEM ) checkOom(pCheck);
    checkAppendMsg(pCheck, "Failed to read ptrmap key=%u", iChild);
    return;
  }

  if( ePtrmapType!=eType || iPtrmapParent!=iParent ){
    checkAppendMsg(pCheck,
      "Bad ptr map entry key=%u expected=(%u,%u) got=(%u,%u)",
      iChild, eType, iParent, ePtrmapType, iPtrmapParent);
  }
}